

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O0

void __thiscall
Assimp::MMDImporter::CreateDataFromImport(MMDImporter *this,PmxModel *pModel,aiScene *pScene)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  aiNode *paVar7;
  ulong uVar8;
  uint *puVar9;
  void *pvVar10;
  type pPVar11;
  aiMesh *paVar12;
  aiNode **__p;
  type pPVar13;
  type ppaVar14;
  pointer ppaVar15;
  type pPVar16;
  aiMaterial *paVar17;
  undefined1 local_120 [8];
  FlipWindingOrderProcess windingFlipper;
  FlipUVsProcess uvFlipper;
  MakeLeftHandedProcess convertProcess;
  uint i_3;
  aiVector3D v3;
  PmxBone *bone;
  int i_2;
  int i_1;
  unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> ppNode;
  int local_a8;
  int indexCount;
  uint indexStart;
  uint i;
  uint index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  aiNode *local_28;
  aiNode *pNode;
  aiScene *pScene_local;
  PmxModel *pModel_local;
  MMDImporter *this_local;
  
  if (pModel != (PmxModel *)0x0) {
    pNode = (aiNode *)pScene;
    pScene_local = (aiScene *)pModel;
    pModel_local = (PmxModel *)this;
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    local_28 = paVar7;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      aiString::Set(&local_28->mName,(string *)&pScene_local->mNumMeshes);
    }
    *(aiNode **)((pNode->mName).data + 4) = local_28;
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    local_28 = paVar7;
    aiNode::addChildren(*(aiNode **)((pNode->mName).data + 4),1,&local_28);
    paVar7 = local_28;
    std::__cxx11::string::string((string *)&local_78,(string *)&pScene_local->mNumMeshes);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&index,"_mesh",(allocator *)((long)&i + 3));
    std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
    aiString::Set(&paVar7->mName,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&index);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    std::__cxx11::string::~string((string *)&local_78);
    local_28->mNumMeshes = pScene_local[1].mNumTextures;
    auVar6 = ZEXT416(local_28->mNumMeshes) * ZEXT816(4);
    uVar8 = auVar6._0_8_;
    if (auVar6._8_8_ != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar9 = (uint *)operator_new__(uVar8);
    local_28->mMeshes = puVar9;
    for (indexStart = 0; indexStart < local_28->mNumMeshes; indexStart = indexStart + 1) {
      local_28->mMeshes[indexStart] = indexStart;
    }
    *(uint *)((pNode->mName).data + 0xc) = pScene_local[1].mNumTextures;
    auVar6 = ZEXT416(*(uint *)((pNode->mName).data + 0xc)) * ZEXT816(8);
    uVar8 = auVar6._0_8_;
    if (auVar6._8_8_ != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar8);
    *(void **)((pNode->mName).data + 0x14) = pvVar10;
    local_a8 = 0;
    for (indexCount = 0; (uint)indexCount < *(uint *)((pNode->mName).data + 0xc);
        indexCount = indexCount + 1) {
      pPVar11 = std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::
                operator[]((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>
                            *)&pScene_local[1].mTextures,(ulong)(uint)indexCount);
      ppNode._M_t.super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>._M_t.
      super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>.
      super__Head_base<0UL,_aiNode_**,_false>._M_head_impl._4_4_ = pPVar11->index_count;
      paVar12 = CreateMesh(this,(PmxModel *)pScene_local,local_a8,
                           ppNode._M_t.
                           super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>._M_t.
                           super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>.
                           super__Head_base<0UL,_aiNode_**,_false>._M_head_impl._4_4_);
      *(aiMesh **)(*(long *)((pNode->mName).data + 0x14) + (ulong)(uint)indexCount * 8) = paVar12;
      pPVar11 = std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::
                operator[]((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>
                            *)&pScene_local[1].mTextures,(ulong)(uint)indexCount);
      aiString::operator=((aiString *)
                          (*(long *)(*(long *)((pNode->mName).data + 0x14) +
                                    (ulong)(uint)indexCount * 8) + 0xec),&pPVar11->material_name);
      *(int *)(*(long *)(*(long *)((pNode->mName).data + 0x14) + (ulong)(uint)indexCount * 8) + 0xe8
              ) = indexCount;
      local_a8 = ppNode._M_t.super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>._M_t.
                 super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>.
                 super__Head_base<0UL,_aiNode_**,_false>._M_head_impl._4_4_ + local_a8;
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(int)pScene_local[1].mNumLights;
    uVar8 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    __p = (aiNode **)operator_new__(uVar8);
    std::unique_ptr<aiNode*[],std::default_delete<aiNode*[]>>::
    unique_ptr<aiNode**,std::default_delete<aiNode*[]>,void,bool>
              ((unique_ptr<aiNode*[],std::default_delete<aiNode*[]>> *)&i_2,__p);
    for (bone._4_4_ = 0; bone._4_4_ < (int)pScene_local[1].mNumLights; bone._4_4_ = bone._4_4_ + 1)
    {
      paVar7 = (aiNode *)operator_new(0x478);
      pPVar13 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                          ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
                           &pScene_local[1].mLights,(long)bone._4_4_);
      aiNode::aiNode(paVar7,&pPVar13->bone_name);
      ppaVar14 = std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::operator[]
                           ((unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> *)&i_2,
                            (long)bone._4_4_);
      *ppaVar14 = paVar7;
    }
    for (bone._0_4_ = 0; (int)bone < (int)pScene_local[1].mNumLights; bone._0_4_ = (int)bone + 1) {
      pPVar13 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                          ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
                           &pScene_local[1].mLights,(long)(int)bone);
      if (pPVar13->parent_index < 0) {
        paVar7 = *(aiNode **)((pNode->mName).data + 4);
        ppaVar15 = std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::get
                             ((unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> *)&i_2);
        aiNode::addChildren(paVar7,1,ppaVar15 + (int)bone);
      }
      else {
        ppaVar14 = std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::operator[]
                             ((unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> *)&i_2,
                              (long)pPVar13->parent_index);
        paVar7 = *ppaVar14;
        ppaVar15 = std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::get
                             ((unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> *)&i_2);
        aiNode::addChildren(paVar7,1,ppaVar15 + (int)bone);
        fVar1 = pPVar13->position[0];
        pPVar16 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                            ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
                             &pScene_local[1].mLights,(long)pPVar13->parent_index);
        fVar2 = pPVar16->position[0];
        fVar3 = pPVar13->position[1];
        pPVar16 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                            ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
                             &pScene_local[1].mLights,(long)pPVar13->parent_index);
        fVar4 = pPVar16->position[1];
        fVar5 = pPVar13->position[2];
        pPVar13 = std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::operator[]
                            ((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)
                             &pScene_local[1].mLights,(long)pPVar13->parent_index);
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)((long)&convertProcess.super_BaseProcess.progress + 4),
                   fVar1 - fVar2,fVar3 - fVar4,fVar5 - pPVar13->position[2]);
        ppaVar14 = std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::operator[]
                             ((unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> *)&i_2,
                              (long)(int)bone);
        aiMatrix4x4t<float>::Translation
                  ((aiVector3t<float> *)((long)&convertProcess.super_BaseProcess.progress + 4),
                   &(*ppaVar14)->mTransformation);
      }
    }
    *(uint *)((pNode->mName).data + 0x1c) = pScene_local[1].mNumTextures;
    pvVar10 = operator_new__((ulong)*(uint *)((pNode->mName).data + 0x1c) << 3);
    *(void **)((pNode->mName).data + 0x24) = pvVar10;
    for (convertProcess.super_BaseProcess.progress._0_4_ = 0;
        (uint)convertProcess.super_BaseProcess.progress < *(uint *)((pNode->mName).data + 0x1c);
        convertProcess.super_BaseProcess.progress._0_4_ =
             (uint)convertProcess.super_BaseProcess.progress + 1) {
      pPVar11 = std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::
                operator[]((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>
                            *)&pScene_local[1].mTextures,
                           (ulong)(uint)convertProcess.super_BaseProcess.progress);
      paVar17 = CreateMaterial(this,pPVar11,(PmxModel *)pScene_local);
      *(aiMaterial **)
       (*(long *)((pNode->mName).data + 0x24) +
       (ulong)(uint)convertProcess.super_BaseProcess.progress * 8) = paVar17;
    }
    MakeLeftHandedProcess::MakeLeftHandedProcess
              ((MakeLeftHandedProcess *)&uvFlipper.super_BaseProcess.progress);
    MakeLeftHandedProcess::Execute
              ((MakeLeftHandedProcess *)&uvFlipper.super_BaseProcess.progress,(aiScene *)pNode);
    FlipUVsProcess::FlipUVsProcess((FlipUVsProcess *)&windingFlipper.super_BaseProcess.progress);
    FlipUVsProcess::Execute
              ((FlipUVsProcess *)&windingFlipper.super_BaseProcess.progress,(aiScene *)pNode);
    FlipWindingOrderProcess::FlipWindingOrderProcess((FlipWindingOrderProcess *)local_120);
    FlipWindingOrderProcess::Execute((FlipWindingOrderProcess *)local_120,(aiScene *)pNode);
    FlipWindingOrderProcess::~FlipWindingOrderProcess((FlipWindingOrderProcess *)local_120);
    FlipUVsProcess::~FlipUVsProcess((FlipUVsProcess *)&windingFlipper.super_BaseProcess.progress);
    MakeLeftHandedProcess::~MakeLeftHandedProcess
              ((MakeLeftHandedProcess *)&uvFlipper.super_BaseProcess.progress);
    std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::~unique_ptr
              ((unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> *)&i_2);
  }
  return;
}

Assistant:

void MMDImporter::CreateDataFromImport(const pmx::PmxModel *pModel,
                                       aiScene *pScene) {
  if (pModel == NULL) {
    return;
  }

  aiNode *pNode = new aiNode;
  if (!pModel->model_name.empty()) {
    pNode->mName.Set(pModel->model_name);
  }

  pScene->mRootNode = pNode;

  pNode = new aiNode;
  pScene->mRootNode->addChildren(1, &pNode);
  pNode->mName.Set(string(pModel->model_name) + string("_mesh"));

  // split mesh by materials
  pNode->mNumMeshes = pModel->material_count;
  pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
  for (unsigned int index = 0; index < pNode->mNumMeshes; index++) {
    pNode->mMeshes[index] = index;
  }

  pScene->mNumMeshes = pModel->material_count;
  pScene->mMeshes = new aiMesh *[pScene->mNumMeshes];
  for (unsigned int i = 0, indexStart = 0; i < pScene->mNumMeshes; i++) {
    const int indexCount = pModel->materials[i].index_count;

    pScene->mMeshes[i] = CreateMesh(pModel, indexStart, indexCount);
    pScene->mMeshes[i]->mName = pModel->materials[i].material_name;
    pScene->mMeshes[i]->mMaterialIndex = i;
    indexStart += indexCount;
  }

  // create node hierarchy for bone position
  std::unique_ptr<aiNode *[]> ppNode(new aiNode *[pModel->bone_count]);
  for (auto i = 0; i < pModel->bone_count; i++) {
    ppNode[i] = new aiNode(pModel->bones[i].bone_name);
  }

  for (auto i = 0; i < pModel->bone_count; i++) {
    const pmx::PmxBone &bone = pModel->bones[i];

    if (bone.parent_index < 0) {
      pScene->mRootNode->addChildren(1, ppNode.get() + i);
    } else {
      ppNode[bone.parent_index]->addChildren(1, ppNode.get() + i);

      aiVector3D v3 = aiVector3D(
          bone.position[0] - pModel->bones[bone.parent_index].position[0],
          bone.position[1] - pModel->bones[bone.parent_index].position[1],
          bone.position[2] - pModel->bones[bone.parent_index].position[2]);
      aiMatrix4x4::Translation(v3, ppNode[i]->mTransformation);
    }
  }

  // create materials
  pScene->mNumMaterials = pModel->material_count;
  pScene->mMaterials = new aiMaterial *[pScene->mNumMaterials];
  for (unsigned int i = 0; i < pScene->mNumMaterials; i++) {
    pScene->mMaterials[i] = CreateMaterial(&pModel->materials[i], pModel);
  }

  // Convert everything to OpenGL space
  MakeLeftHandedProcess convertProcess;
  convertProcess.Execute(pScene);

  FlipUVsProcess uvFlipper;
  uvFlipper.Execute(pScene);

  FlipWindingOrderProcess windingFlipper;
  windingFlipper.Execute(pScene);
}